

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::updateEdit(QDateTimeEditPrivate *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int selsize;
  int cursor;
  QString newText;
  QSignalBlocker blocker;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint pos;
  undefined4 in_stack_ffffffffffffff68;
  int iVar4;
  undefined4 in_stack_ffffffffffffff6c;
  QAbstractSpinBoxPrivate *this_00;
  QLineEdit *in_stack_ffffffffffffff78;
  QString local_60;
  undefined1 local_48 [24];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  bVar1 = QAbstractSpinBoxPrivate::specialValue(in_RDI);
  if (bVar1) {
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xd8))(&local_30,in_RDI,&in_RDI->value);
  }
  (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x110))(local_48);
  bVar1 = ::operator==((QString *)in_RDI,
                       (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  pos = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
  QString::~QString((QString *)0x560905);
  if ((pos & 0x1000000) == 0) {
    QLineEdit::selectedText
              ((QLineEdit *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    qVar3 = QString::size(&local_60);
    iVar2 = (int)qVar3;
    QString::~QString((QString *)0x560949);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = iVar2;
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)this_00,(QObject *)CONCAT44(in_stack_ffffffffffffff6c,iVar2));
    QLineEdit::setText((QLineEdit *)in_RDI,(QString *)CONCAT44(pos,iVar2));
    bVar1 = QAbstractSpinBoxPrivate::specialValue(in_RDI);
    if (!bVar1) {
      QDateTimeParser::sectionPos((int)in_RDI + 0x3d8);
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x110))(&stack0xffffffffffffff78);
      QString::size((QString *)&stack0xffffffffffffff78);
      qBound<int,long_long>
                ((int *)this_00,(int *)CONCAT44(in_stack_ffffffffffffff6c,iVar4),(longlong *)in_RDI)
      ;
      QString::~QString((QString *)0x560a19);
      if (iVar4 < 1) {
        QLineEdit::setCursorPosition((QLineEdit *)in_RDI,pos);
      }
      else {
        QLineEdit::setSelection
                  (in_stack_ffffffffffffff78,(int)((ulong)this_00 >> 0x20),(int)this_00);
      }
    }
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_RDI);
  }
  QString::~QString((QString *)0x560a71);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::updateEdit()
{
    const QString newText = (specialValue() ? specialValueText : textFromValue(value));
    if (newText == displayText())
        return;
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);

    edit->setText(newText);

    if (!specialValue()
#ifdef QT_KEYPAD_NAVIGATION
        && !(QApplicationPrivate::keypadNavigationEnabled() && !edit->hasEditFocus())
#endif
            ) {
        int cursor = sectionPos(currentSectionIndex);
        QDTEDEBUG << "cursor is " << cursor << currentSectionIndex;
        cursor = qBound(0, cursor, displayText().size());
        QDTEDEBUG << cursor;
        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
            QDTEDEBUG << cursor << selsize;
        } else {
            edit->setCursorPosition(cursor);
            QDTEDEBUG << cursor;

        }
    }
}